

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-semaphore.c
# Opt level: O0

int run_test_semaphore_2(void)

{
  int iVar1;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  worker_config_conflict1 wc;
  uv_thread_t thread;
  
  memset(&eval_a,0,0x50);
  wc.sem._24_4_ = 100;
  iVar1 = uv_sem_init((undefined1 *)((long)&wc.mutex + 0x20),0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-semaphore.c"
            ,0x51,"uv_sem_init(&wc.sem, 0)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_mutex_init(&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-semaphore.c"
            ,0x52,"uv_mutex_init(&wc.mutex)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_thread_create(&wc.delay,worker,&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-semaphore.c"
            ,0x53,"uv_thread_create(&thread, worker, &wc)","==","0",(long)iVar1,"==",0);
    abort();
  }
  uv_sem_wait((undefined1 *)((long)&wc.mutex + 0x20));
  iVar1 = uv_thread_join(&wc.delay);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-semaphore.c"
            ,0x57,"uv_thread_join(&thread)","==","0",(long)iVar1,"==",0);
    abort();
  }
  uv_mutex_destroy(&eval_a);
  uv_sem_destroy((undefined1 *)((long)&wc.mutex + 0x20));
  return 0;
}

Assistant:

TEST_IMPL(semaphore_2) {
  uv_thread_t thread;
  worker_config wc;

  memset(&wc, 0, sizeof(wc));
  wc.delay = 100;

  ASSERT_OK(uv_sem_init(&wc.sem, 0));
  ASSERT_OK(uv_mutex_init(&wc.mutex));
  ASSERT_OK(uv_thread_create(&thread, worker, &wc));

  uv_sem_wait(&wc.sem);

  ASSERT_OK(uv_thread_join(&thread));
  uv_mutex_destroy(&wc.mutex);
  uv_sem_destroy(&wc.sem);

  return 0;
}